

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptimeutilities.h
# Opt level: O0

RTPNTPTime __thiscall jrtplib::RTPTime::GetNTPTime(RTPTime *this)

{
  double x;
  uint32_t lsw;
  uint32_t msw;
  uint32_t microsec;
  uint32_t sec;
  RTPTime *this_local;
  
  RTPNTPTime::RTPNTPTime
            ((RTPNTPTime *)&this_local,(int)(long)this->m_t + 0x83aa7e80,
             (uint32_t)
             (long)(((double)((long)((this->m_t - (double)((long)this->m_t & 0xffffffff)) *
                                    1000000.0) & 0xffffffff) / 1000000.0) * 4294967296.0));
  return (RTPNTPTime)this_local;
}

Assistant:

inline RTPNTPTime RTPTime::GetNTPTime() const
{
	uint32_t sec = (uint32_t)m_t;
	uint32_t microsec = (uint32_t)((m_t - (double)sec)*1e6);

	uint32_t msw = sec+RTP_NTPTIMEOFFSET;
	uint32_t lsw;
	double x;
	
    x = microsec/1000000.0;
	x *= (65536.0*65536.0);
	lsw = (uint32_t)x;

	return RTPNTPTime(msw,lsw);
}